

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,MatrixType *A,int max_iter,
          Scalar eps)

{
  Index size;
  MatrixType *this_00;
  non_const_type local_90;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_88;
  Index local_78;
  Index local_70;
  Index local_68;
  Index local_60;
  Index local_58;
  Index local_50;
  Index local_48 [3];
  Index local_30;
  Index local_28;
  Scalar local_20;
  int local_1c;
  Scalar eps_local;
  int max_iter_local;
  MatrixType *A_local;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  this->_max_iter = max_iter;
  this->_num_ls = 0;
  this->_epsilon = eps;
  this_00 = &this->_A;
  local_20 = eps;
  local_1c = max_iter;
  _eps_local = (DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)A;
  A_local = (MatrixType *)this;
  Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix(this_00,A);
  local_28 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&this_00->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  local_30 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&this_00->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  Matrix<float,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->_AtA,&local_28,&local_30);
  local_48[0] = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                          (&(this->_A).
                            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_x,local_48);
  local_50 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_w,&local_50);
  local_58 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_y,&local_58);
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix(&this->_Atb);
  size = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                   (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  PermutationMatrix<-1,_-1,_long>::PermutationMatrix(&this->_P,size);
  local_60 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  local_68 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  Matrix<float,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->_QR,&local_60,&local_68);
  local_70 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_qrCoeffs,&local_70);
  local_78 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                       (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>)
  ;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_tempVector,&local_78);
  local_90 = (non_const_type)
             DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose(_eps_local);
  local_88 = MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>> *)
                        &local_90,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)_eps_local
                       );
  Matrix<float,-1,-1,0,-1,-1>::operator=
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->_AtA,
             (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
              *)&local_88);
  return;
}

Assistant:

NNLS(const MatrixType &A, int max_iter=-1, Scalar eps=1e-10)
    : _max_iter(max_iter), _num_ls(0), _epsilon(eps),
      _A(A), _AtA(_A.cols(), _A.cols()),
      _x(_A.cols()), _w(_A.cols()), _y(_A.cols()),
      _P(_A.cols()), _QR(_A.rows(), _A.cols()), _qrCoeffs(_A.cols()), _tempVector(_A.cols())
  {
    // Ensure Scalar type is real.
    EIGEN_STATIC_ASSERT(!NumTraits<Scalar>::IsComplex, NUMERIC_TYPE_MUST_BE_REAL);

    // Precompute A^T*A
    _AtA = A.transpose() * A;
  }